

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

void p_bracket(parse *p)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  cset *pcVar10;
  size_t *psVar11;
  size_t sVar12;
  ushort **ppuVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  re_guts *prVar17;
  uch uVar18;
  byte bVar19;
  cclass *pcVar20;
  cset *pcVar21;
  cset *cs;
  int iVar22;
  uch *puVar23;
  sop op;
  ulong uVar24;
  char *pcVar25;
  char *pcVar26;
  uint uVar27;
  char *pcVar28;
  byte *__s1;
  char *pcVar29;
  
  prVar17 = p->g;
  uVar27 = prVar17->ncsets;
  prVar17->ncsets = uVar27 + 1;
  iVar9 = prVar17->csetsize;
  uVar8 = p->ncsalloc;
  if ((int)uVar27 < (int)uVar8) {
    pcVar10 = prVar17->sets;
LAB_00104aea:
    if (pcVar10 == (cset *)0x0) {
      __assert_fail("p->g->sets != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x495,"cset *allocset()");
    }
  }
  else {
    iVar22 = (int)((long)(int)uVar8 + 8);
    p->ncsalloc = iVar22;
    if ((uVar8 & 7) != 0) {
      __assert_fail("nc % CHAR_BIT == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x47b,"cset *allocset()");
    }
    iVar22 = (iVar22 >> 3) * iVar9;
    sVar12 = ((long)(int)uVar8 + 8) * 0x20;
    if (prVar17->sets == (cset *)0x0) {
      pcVar10 = (cset *)malloc(sVar12);
    }
    else {
      pcVar10 = (cset *)realloc(prVar17->sets,sVar12);
      prVar17 = p->g;
    }
    prVar17->sets = pcVar10;
    if (prVar17->setbits == (uch *)0x0) {
      puVar23 = (uch *)malloc((long)iVar22);
      prVar17->setbits = puVar23;
    }
    else {
      puVar23 = (uch *)realloc(prVar17->setbits,(long)iVar22);
      prVar17 = p->g;
      prVar17->setbits = puVar23;
      if (0 < (int)uVar27) {
        pcVar10 = prVar17->sets;
        uVar14 = 0;
        do {
          pcVar10->ptr = puVar23 + (uVar14 >> 3 & 0x1fffffff) * (long)iVar9;
          uVar14 = uVar14 + 1;
          pcVar10 = pcVar10 + 1;
        } while (uVar27 != uVar14);
      }
    }
    pcVar10 = prVar17->sets;
    if ((puVar23 == (uch *)0x0) || (pcVar10 == (cset *)0x0)) {
      if (p->error == 0) {
        p->error = 0xc;
      }
      p->next = nuls;
      p->end = nuls;
      uVar27 = 0;
      goto LAB_00104aea;
    }
    memset(puVar23 + (iVar22 - iVar9),0,(long)iVar9);
  }
  uVar8 = uVar27 + 7;
  if (-1 < (int)uVar27) {
    uVar8 = uVar27;
  }
  puVar23 = prVar17->setbits + ((int)uVar8 >> 3) * iVar9;
  pcVar10[(int)uVar27].ptr = puVar23;
  bVar19 = (byte)(1 << ((byte)uVar27 & 7));
  pcVar10[(int)uVar27].mask = bVar19;
  pcVar10[(int)uVar27].hash = '\0';
  pcVar10[(int)uVar27].smultis = 0;
  (&pcVar10[(int)uVar27].smultis)[1] = 0;
  __s1 = (byte *)p->next;
  pbVar2 = (byte *)p->end;
  if (__s1 + 5 < pbVar2) {
    iVar9 = strncmp((char *)__s1,"[:<:]]",6);
    if (iVar9 == 0) {
      op = 0x4c000000;
LAB_00104f9f:
      doemit(p,op,0);
      p->next = p->next + 6;
      return;
    }
    iVar9 = strncmp((char *)__s1,"[:>:]]",6);
    if (iVar9 == 0) {
      op = 0x50000000;
      goto LAB_00104f9f;
    }
  }
  if ((__s1 < pbVar2) && (*__s1 == 0x5e)) {
    __s1 = __s1 + 1;
    p->next = (char *)__s1;
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  cs = pcVar10 + (int)uVar27;
  if (__s1 < pbVar2) {
    bVar1 = *__s1;
    uVar14 = (ulong)bVar1;
    if (bVar1 != 0x5d) {
      if (bVar1 != 0x2d) goto LAB_00104bdc;
      uVar14 = 0x2d;
    }
    p->next = (char *)(__s1 + 1);
    puVar23[uVar14] = puVar23[uVar14] | bVar19;
    cs->hash = cs->hash + bVar1;
  }
LAB_00104bdc:
  pcVar29 = p->next;
  pcVar28 = p->end;
  if (pcVar29 < pcVar28) {
    psVar11 = &pcVar10[(int)uVar27].smultis;
LAB_00104bfd:
    cVar7 = *pcVar29;
    if (cVar7 != ']') {
      pcVar25 = pcVar29 + 1;
      if (cVar7 != '-' || pcVar28 <= pcVar25) {
        if (cVar7 != '[') {
          if (cVar7 != '-') goto LAB_00104d3e;
          goto LAB_001050a2;
        }
        if (pcVar28 <= pcVar25) {
LAB_00104d3e:
          cVar6 = p_b_symbol(p);
          pcVar29 = p->next;
          cVar7 = cVar6;
          if (((pcVar29 < p->end) && (*pcVar29 == '-')) &&
             ((pcVar28 = pcVar29 + 1, pcVar28 < p->end && (*pcVar28 != ']')))) {
            p->next = pcVar28;
            if (*pcVar28 == '-') {
              p->next = pcVar29 + 2;
              cVar7 = '-';
            }
            else {
              cVar7 = p_b_symbol(p);
            }
            if (cVar7 < cVar6) goto LAB_001050a2;
          }
          lVar15 = (long)cVar6;
          do {
            cs->ptr[lVar15] = cs->ptr[lVar15] | cs->mask;
            cs->hash = cs->hash + (char)lVar15;
            lVar15 = lVar15 + 1;
          } while ((long)cVar7 + 1 != lVar15);
          pcVar29 = p->next;
          pcVar28 = p->end;
          goto LAB_00104dad;
        }
        if (*pcVar25 != '=') {
          if (*pcVar25 == ':') {
            pcVar29 = pcVar29 + 2;
            p->next = pcVar29;
            if (pcVar28 <= pcVar29) {
              if (p->error == 0) {
                p->error = 7;
              }
              pcVar29 = nuls;
              p->next = nuls;
              p->end = nuls;
              pcVar28 = nuls;
            }
            if ((*pcVar29 == ']') || (*pcVar29 == '-')) {
              if (p->error == 0) {
                p->error = 4;
              }
              p->next = nuls;
              p->end = nuls;
              pcVar29 = nuls;
              pcVar25 = nuls;
            }
            else {
              pcVar25 = pcVar29;
              if (pcVar29 < pcVar28) {
                ppuVar13 = __ctype_b_loc();
                pcVar26 = pcVar29;
                do {
                  pcVar25 = pcVar26;
                  if ((*(byte *)((long)*ppuVar13 + (long)*pcVar26 * 2 + 1) & 4) == 0) break;
                  pcVar26 = pcVar26 + 1;
                  p->next = pcVar26;
                  pcVar25 = pcVar28;
                } while (pcVar26 != pcVar28);
              }
            }
            pcVar20 = cclasses;
            pcVar28 = "alnum";
LAB_00104cc0:
            pcVar20 = pcVar20 + 1;
            iVar9 = strncmp(pcVar28,pcVar29,(long)pcVar25 - (long)pcVar29);
            if ((iVar9 != 0) || (pcVar28[(long)pcVar25 - (long)pcVar29] != '\0')) goto LAB_00104cde;
            pcVar29 = pcVar20[-1].chars;
            cVar7 = *pcVar29;
            while (cVar7 != '\0') {
              pcVar29 = pcVar29 + 1;
              cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
              cs->hash = cs->hash + cVar7;
              cVar7 = *pcVar29;
            }
            pcVar29 = pcVar20[-1].multis;
            if (*pcVar29 != '\0') {
              pcVar28 = cs->multis;
              do {
                sVar3 = *psVar11;
                sVar12 = strlen(pcVar29);
                sVar12 = sVar3 + sVar12 + 1;
                *psVar11 = sVar12;
                if (pcVar28 == (char *)0x0) {
                  pcVar28 = (char *)malloc(sVar12);
                }
                else {
                  pcVar28 = (char *)realloc(pcVar28,sVar12);
                }
                cs->multis = pcVar28;
                if (pcVar28 == (char *)0x0) {
                  if (p->error == 0) {
                    p->error = 0xc;
                  }
                  p->next = nuls;
                  p->end = nuls;
                }
                else {
                  strcpy(pcVar28 + (sVar3 - 1),pcVar29);
                  pcVar28[*psVar11 - 1] = '\0';
                }
                sVar12 = strlen(pcVar29);
                pcVar29 = pcVar29 + sVar12 + 1;
              } while (*pcVar29 != '\0');
            }
            goto LAB_00104d09;
          }
          goto LAB_00104d3e;
        }
        pcVar29 = pcVar29 + 2;
        p->next = pcVar29;
        if (pcVar28 <= pcVar29) {
          if (p->error == 0) {
            p->error = 7;
          }
          pcVar29 = nuls;
          p->next = nuls;
          p->end = nuls;
        }
        if ((*pcVar29 == ']') || (*pcVar29 == '-')) {
          if (p->error == 0) {
            p->error = 3;
          }
          p->next = nuls;
          p->end = nuls;
        }
        cVar7 = p_b_coll_elem(p,0x3d);
        cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
        cs->hash = cs->hash + cVar7;
        pcVar29 = p->next;
        pcVar28 = p->end;
        if (pcVar28 <= pcVar29) goto LAB_001052c7;
        if (((pcVar29 + 1 < pcVar28) && (*pcVar29 == '=')) && (pcVar29[1] == ']'))
        goto LAB_00104e5a;
        if (p->error == 0) {
          iVar9 = 3;
          goto LAB_001050ad;
        }
        goto LAB_001050b0;
      }
      if (*pcVar25 != ']') {
LAB_001050a2:
        if (p->error == 0) {
          iVar9 = 0xb;
          goto LAB_001050ad;
        }
        goto LAB_001050b0;
      }
      p->next = pcVar25;
      cs->ptr[0x2d] = cs->ptr[0x2d] | cs->mask;
      cs->hash = cs->hash + '-';
      pcVar29 = p->next;
      pcVar28 = p->end;
    }
  }
LAB_00104fd8:
  if ((pcVar29 < pcVar28) && (p->next = pcVar29 + 1, *pcVar29 == ']')) {
    if (p->error == 0) {
      if ((p->g->cflags & 2) != 0) {
        uVar14 = (ulong)p->g->csetsize;
        if (0 < (long)uVar14) {
          do {
            uVar24 = uVar14 - 1;
            if (((cs->ptr[uVar24 & 0xff] & cs->mask) != 0) &&
               (ppuVar13 = __ctype_b_loc(), (*(byte *)((long)*ppuVar13 + uVar14 * 2 + -1) & 4) != 0)
               ) {
              cVar7 = othercase((int)uVar24);
              if (uVar24 != (uint)(int)cVar7) {
                cs->ptr[cVar7] = cs->ptr[cVar7] | cs->mask;
                cs->hash = cs->hash + cVar7;
              }
            }
            bVar4 = 1 < uVar14;
            uVar14 = uVar24;
          } while (bVar4);
        }
        if (cs->multis != (char *)0x0) {
          __assert_fail("cs->multis == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x282,"void p_bracket()");
        }
      }
      if (bVar5) {
        if (cs->multis != (char *)0x0) {
          __assert_fail("cs->multis == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x299,"void p_bracket()");
        }
      }
      else {
        prVar17 = p->g;
        uVar24 = (ulong)prVar17->csetsize;
        uVar14 = uVar24;
        if (0 < (long)uVar24) {
          do {
            uVar16 = uVar14 - 1;
            uVar24 = uVar24 - 1;
            puVar23 = cs->ptr;
            bVar19 = cs->mask;
            if ((puVar23[uVar16 & 0xff] & bVar19) == 0) {
              puVar23[uVar16] = puVar23[uVar16] | bVar19;
              uVar18 = cs->hash + (char)uVar16;
            }
            else {
              puVar23[uVar16] = puVar23[uVar16] & ~bVar19;
              uVar18 = cs->hash - (char)uVar24;
            }
            cs->hash = uVar18;
            bVar5 = 1 < uVar14;
            uVar14 = uVar16;
          } while (bVar5);
          prVar17 = p->g;
        }
        if ((prVar17->cflags & 8) != 0) {
          cs->ptr[10] = cs->ptr[10] & ~cs->mask;
          cs->hash = cs->hash + 0xf6;
        }
        if (cs->multis != (char *)0x0) {
          __assert_fail("cs->multis == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x292,"void p_bracket()");
        }
      }
      prVar17 = p->g;
      uVar14 = (ulong)prVar17->csetsize;
      if (uVar14 != 0) {
        iVar9 = 0;
        uVar24 = 0;
        do {
          iVar9 = (iVar9 + 1) - (uint)((cs->ptr[uVar24 & 0xff] & cs->mask) == 0);
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
        if (iVar9 == 1) {
          iVar9 = 0;
          uVar24 = 0;
          do {
            if ((cs->ptr[uVar24 & 0xff] & cs->mask) != 0) {
              ordinary(p,iVar9 >> 0x18);
              freeset(p,cs);
              return;
            }
            uVar24 = uVar24 + 1;
            iVar9 = iVar9 + 0x1000000;
          } while (uVar14 != uVar24);
          __assert_fail("never",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x4e7,"int firstch()");
        }
      }
      pcVar10 = prVar17->sets;
      if (0 < (long)prVar17->ncsets) {
        pcVar21 = pcVar10;
        do {
          if ((pcVar21 != cs) && (pcVar21->hash == cs->hash)) {
            if (prVar17->csetsize == 0) {
              uVar24 = 0;
            }
            else {
              uVar24 = 0;
              while (((pcVar21->ptr[uVar24 & 0xff] & pcVar21->mask) != 0) !=
                     ((cs->ptr[uVar24 & 0xff] & cs->mask) == 0)) {
                uVar24 = uVar24 + 1;
                if (uVar14 == uVar24) goto LAB_0010523f;
              }
            }
            if (uVar24 == uVar14) {
LAB_0010523f:
              freeset(p,cs);
              pcVar10 = p->g->sets;
              cs = pcVar21;
              break;
            }
          }
          pcVar21 = pcVar21 + 1;
        } while (pcVar21 < pcVar10 + prVar17->ncsets);
      }
      doemit(p,0x18000000,(long)(int)((ulong)((long)cs - (long)pcVar10) >> 5));
      return;
    }
  }
  else {
LAB_001050b0:
    if (p->error == 0) {
      p->error = 7;
    }
    p->next = nuls;
    p->end = nuls;
  }
  return;
LAB_00104cde:
  pcVar28 = pcVar20->name;
  if (pcVar28 == (char *)0x0) goto code_r0x00104cea;
  goto LAB_00104cc0;
code_r0x00104cea:
  if (p->error == 0) {
    p->error = 4;
  }
  p->next = nuls;
  p->end = nuls;
LAB_00104d09:
  pcVar29 = p->next;
  pcVar28 = p->end;
  if (pcVar29 < pcVar28) {
    if (((pcVar29 + 1 < pcVar28) && (*pcVar29 == ':')) && (pcVar29[1] == ']')) {
LAB_00104e5a:
      pcVar29 = pcVar29 + 2;
      p->next = pcVar29;
LAB_00104dad:
      if (pcVar28 <= pcVar29) goto LAB_00104fd8;
      goto LAB_00104bfd;
    }
    if (p->error != 0) goto LAB_001050b0;
    iVar9 = 4;
  }
  else {
LAB_001052c7:
    if (p->error != 0) goto LAB_001050b0;
    iVar9 = 7;
  }
LAB_001050ad:
  p->error = iVar9;
  goto LAB_001050b0;
}

Assistant:

static void
p_bracket(p)
struct parse *p;
{
	cset *cs = allocset(p);
	int invert = 0;

	/* Dept of Truly Sickening Special-Case Kludges */
	if (p->next + 5 < p->end && strncmp(p->next, "[:<:]]", 6) == 0) {
		EMIT(OBOW, 0);
		NEXTn(6);
		return;
	}
	if (p->next + 5 < p->end && strncmp(p->next, "[:>:]]", 6) == 0) {
		EMIT(OEOW, 0);
		NEXTn(6);
		return;
	}

	if (EAT('^'))
		invert++;	/* make note to invert set at end */
	if (EAT(']'))
		CHadd(cs, ']');
	else if (EAT('-'))
		CHadd(cs, '-');
	while (MORE() && PEEK() != ']' && !SEETWO('-', ']'))
		p_b_term(p, cs);
	if (EAT('-'))
		CHadd(cs, '-');
	MUSTEAT(']', REG_EBRACK);

	if (p->error != 0)	/* don't mess things up further */
		return;

	if (p->g->cflags&REG_ICASE) {
		int i;
		int ci;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i) && isalpha(i)) {
				ci = othercase(i);
				if (ci != i)
					CHadd(cs, ci);
			}
		assert(cs->multis == NULL);	/* xxx */
#if 0		
		if (cs->multis != NULL)
			mccase(p, cs);
#endif
	}
	if (invert) {
		int i;

		for (i = p->g->csetsize - 1; i >= 0; i--)
			if (CHIN(cs, i))
				CHsub(cs, i);
			else
				CHadd(cs, i);
		if (p->g->cflags&REG_NEWLINE)
			CHsub(cs, '\n');
		assert(cs->multis == NULL);	/* xxx */
#if 0
		if (cs->multis != NULL)
			mcinvert(p, cs);
#endif
	}

	assert(cs->multis == NULL);		/* xxx */

	if (nch(p, cs) == 1) {		/* optimize singleton sets */
		ordinary(p, firstch(p, cs));
		freeset(p, cs);
	} else
		EMIT(OANYOF, freezeset(p, cs));
}